

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O1

int mbedtls_chacha20_update(mbedtls_chacha20_context *ctx,size_t size,uchar *input,uchar *output)

{
  size_t sVar1;
  ulong uVar2;
  uchar *puVar3;
  ulong uVar4;
  uchar *puVar5;
  
  uVar4 = size;
  if (size == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = 0;
    do {
      if (0x3f < ctx->keystream_bytes_used) goto LAB_00114732;
      output[sVar1] = ctx->keystream8[ctx->keystream_bytes_used] ^ input[sVar1];
      ctx->keystream_bytes_used = ctx->keystream_bytes_used + 1;
      sVar1 = sVar1 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    uVar4 = 0;
    sVar1 = size;
  }
LAB_00114732:
  if (0x3f < uVar4) {
    puVar5 = output + sVar1 + 7;
    puVar3 = input + sVar1 + 7;
    do {
      chacha20_block(ctx->state,ctx->keystream8);
      ctx->state[0xc] = ctx->state[0xc] + 1;
      uVar2 = 0xfffffffffffffff8;
      do {
        puVar5[uVar2 + 1] = ctx->keystream8[uVar2 + 8] ^ puVar3[uVar2 + 1];
        puVar5[uVar2 + 2] = ctx->keystream8[uVar2 + 9] ^ puVar3[uVar2 + 2];
        puVar5[uVar2 + 3] = ctx->keystream8[uVar2 + 10] ^ puVar3[uVar2 + 3];
        puVar5[uVar2 + 4] = ctx->keystream8[uVar2 + 0xb] ^ puVar3[uVar2 + 4];
        puVar5[uVar2 + 5] = ctx->keystream8[uVar2 + 0xc] ^ puVar3[uVar2 + 5];
        puVar5[uVar2 + 6] = ctx->keystream8[uVar2 + 0xd] ^ puVar3[uVar2 + 6];
        puVar5[uVar2 + 7] = ctx->keystream8[uVar2 + 0xe] ^ puVar3[uVar2 + 7];
        puVar5[uVar2 + 8] = ctx->keystream8[uVar2 + 0xf] ^ puVar3[uVar2 + 8];
        uVar2 = uVar2 + 8;
      } while (uVar2 < 0x38);
      sVar1 = sVar1 + 0x40;
      uVar4 = uVar4 - 0x40;
      puVar5 = puVar5 + 0x40;
      puVar3 = puVar3 + 0x40;
    } while (0x3f < uVar4);
  }
  if (uVar4 != 0) {
    chacha20_block(ctx->state,ctx->keystream8);
    ctx->state[0xc] = ctx->state[0xc] + 1;
    uVar2 = 0;
    do {
      output[uVar2 + sVar1] = ctx->keystream8[uVar2] ^ input[uVar2 + sVar1];
      uVar2 = uVar2 + 1;
    } while (uVar4 != uVar2);
    ctx->keystream_bytes_used = uVar4;
  }
  return 0;
}

Assistant:

int mbedtls_chacha20_update( mbedtls_chacha20_context *ctx,
                              size_t size,
                              const unsigned char *input,
                              unsigned char *output )
{
    size_t offset = 0U;
    size_t i;

    CHACHA20_VALIDATE_RET( ctx != NULL );
    CHACHA20_VALIDATE_RET( size == 0 || input  != NULL );
    CHACHA20_VALIDATE_RET( size == 0 || output != NULL );

    /* Use leftover keystream bytes, if available */
    while( size > 0U && ctx->keystream_bytes_used < CHACHA20_BLOCK_SIZE_BYTES )
    {
        output[offset] = input[offset]
                       ^ ctx->keystream8[ctx->keystream_bytes_used];

        ctx->keystream_bytes_used++;
        offset++;
        size--;
    }

    /* Process full blocks */
    while( size >= CHACHA20_BLOCK_SIZE_BYTES )
    {
        /* Generate new keystream block and increment counter */
        chacha20_block( ctx->state, ctx->keystream8 );
        ctx->state[CHACHA20_CTR_INDEX]++;

        for( i = 0U; i < 64U; i += 8U )
        {
            output[offset + i  ] = input[offset + i  ] ^ ctx->keystream8[i  ];
            output[offset + i+1] = input[offset + i+1] ^ ctx->keystream8[i+1];
            output[offset + i+2] = input[offset + i+2] ^ ctx->keystream8[i+2];
            output[offset + i+3] = input[offset + i+3] ^ ctx->keystream8[i+3];
            output[offset + i+4] = input[offset + i+4] ^ ctx->keystream8[i+4];
            output[offset + i+5] = input[offset + i+5] ^ ctx->keystream8[i+5];
            output[offset + i+6] = input[offset + i+6] ^ ctx->keystream8[i+6];
            output[offset + i+7] = input[offset + i+7] ^ ctx->keystream8[i+7];
        }

        offset += CHACHA20_BLOCK_SIZE_BYTES;
        size   -= CHACHA20_BLOCK_SIZE_BYTES;
    }

    /* Last (partial) block */
    if( size > 0U )
    {
        /* Generate new keystream block and increment counter */
        chacha20_block( ctx->state, ctx->keystream8 );
        ctx->state[CHACHA20_CTR_INDEX]++;

        for( i = 0U; i < size; i++)
        {
            output[offset + i] = input[offset + i] ^ ctx->keystream8[i];
        }

        ctx->keystream_bytes_used = size;

    }

    return( 0 );
}